

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debughud.cpp
# Opt level: O3

void __thiscall CDebugHud::RenderTuning(CDebugHud *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CGameClient *pCVar3;
  IGraphics *pIVar4;
  ITextRender *pIVar5;
  int iVar6;
  int i;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  float fVar9;
  undefined4 uVar10;
  float Value;
  undefined4 uVar11;
  float Standard;
  float Current;
  CLineItem Array [100];
  float local_708;
  float local_700;
  float local_6fc;
  CTuningParams local_6f8;
  float local_678 [400];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  if (pCVar3->m_pConfig->m_DbgTuning != 0) {
    local_6f8.m_GroundControlSpeed.m_Value = 1000;
    local_6f8.m_GroundControlAccel.m_Value = 200;
    local_6f8.m_GroundFriction.m_Value = 0x32;
    local_6f8.m_GroundJumpImpulse.m_Value = 0x528;
    local_6f8.m_AirJumpImpulse.m_Value = 0x4b0;
    local_6f8.m_AirControlSpeed.m_Value = 500;
    local_6f8.m_AirControlAccel.m_Value = 0x96;
    local_6f8.m_AirFriction.m_Value = 0x5f;
    local_6f8.m_HookLength.m_Value = 38000;
    local_6f8.m_HookFireSpeed.m_Value = 8000;
    local_6f8.m_HookDragAccel.m_Value = 300;
    local_6f8.m_HookDragSpeed.m_Value = 0x5dc;
    local_6f8.m_Gravity.m_Value = 0x32;
    local_6f8.m_VelrampStart.m_Value = 55000;
    local_6f8.m_VelrampRange.m_Value = 200000;
    local_6f8.m_VelrampCurvature.m_Value = 0x8c;
    local_6f8.m_GunCurvature.m_Value = 0x7d;
    local_6f8.m_GunSpeed.m_Value = 220000;
    local_6f8.m_GunLifetime.m_Value = 200;
    local_6f8.m_ShotgunCurvature.m_Value = 0x7d;
    local_6f8.m_ShotgunSpeed.m_Value = 0x43238;
    local_6f8.m_ShotgunSpeeddiff.m_Value = 0x50;
    local_6f8.m_ShotgunLifetime.m_Value = 0x14;
    local_6f8.m_GrenadeCurvature.m_Value = 700;
    local_6f8.m_GrenadeSpeed.m_Value = 100000;
    local_6f8.m_GrenadeLifetime.m_Value = 200;
    local_6f8.m_LaserReach.m_Value = 80000;
    local_6f8.m_LaserBounceDelay.m_Value = 15000;
    local_6f8.m_LaserBounceNum.m_Value = 100;
    local_6f8.m_LaserBounceCost.m_Value = 0;
    local_6f8.m_PlayerCollision.m_Value = 100;
    local_6f8.m_PlayerHooking.m_Value = 100;
    pIVar4 = pCVar3->m_pGraphics;
    uVar1 = pIVar4->m_ScreenWidth;
    uVar2 = pIVar4->m_ScreenHeight;
    (*(pIVar4->super_IInterface)._vptr_IInterface[5])
              (0,0,((float)(int)uVar1 / (float)(int)uVar2) * 300.0);
    if (RenderTuning()::s_CursorStandard == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderTuning()::s_CursorStandard);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderTuning::s_CursorStandard,5.0,25.0,50.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorStandard,&__dso_handle);
        __cxa_guard_release(&RenderTuning()::s_CursorStandard);
      }
    }
    if (RenderTuning()::s_CursorCurrent == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderTuning()::s_CursorCurrent);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderTuning::s_CursorCurrent,5.0,50.0,50.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorCurrent,&__dso_handle);
        __cxa_guard_release(&RenderTuning()::s_CursorCurrent);
      }
    }
    if (RenderTuning()::s_CursorLabels == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderTuning()::s_CursorLabels);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderTuning::s_CursorLabels,5.0,55.0,50.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorLabels,&__dso_handle);
        __cxa_guard_release(&RenderTuning()::s_CursorLabels);
      }
    }
    RenderTuning::s_CursorStandard.m_MaxLines = -1;
    RenderTuning::s_CursorStandard.m_LineSpacing = 1.0;
    RenderTuning::s_CursorStandard.m_Align = 2;
    lVar7 = 0;
    CTextCursor::Reset(&RenderTuning::s_CursorStandard,0);
    RenderTuning::s_CursorCurrent.m_MaxLines = -1;
    RenderTuning::s_CursorCurrent.m_LineSpacing = 1.0;
    RenderTuning::s_CursorCurrent.m_Align = 2;
    CTextCursor::Reset(&RenderTuning::s_CursorCurrent,-1);
    RenderTuning::s_CursorLabels.m_MaxLines = -1;
    RenderTuning::s_CursorLabels.m_LineSpacing = 1.0;
    CTextCursor::Reset(&RenderTuning::s_CursorLabels,0);
    do {
      CTuningParams::Get(&((this->super_CComponent).m_pClient)->m_Tuning,(int)lVar7,&local_6fc);
      CTuningParams::Get(&local_6f8,(int)lVar7,&local_700);
      if ((local_700 != local_6fc) || (NAN(local_700) || NAN(local_6fc))) {
        uVar10 = 0x3e800000;
        uVar11 = 0x3e800000;
      }
      else {
        uVar10 = 0x3f800000;
        uVar11 = 0x3f800000;
      }
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,uVar10,uVar11,0x3f800000);
      str_format((char *)local_678,0x80,"%.2f",SUB84((double)local_700,0));
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&RenderTuning::s_CursorStandard,local_678,0xffffffff);
      str_format((char *)local_678,0x80,"%.2f",SUB84((double)local_6fc,0));
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&RenderTuning::s_CursorCurrent,local_678,0xffffffff);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&RenderTuning::s_CursorLabels,CTuningParams::s_apNames[lVar7],0xffffffff);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[8])(pIVar5,&RenderTuning::s_CursorStandard);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[8])(pIVar5,&RenderTuning::s_CursorCurrent);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[8])(pIVar5,&RenderTuning::s_CursorLabels);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    lVar7 = 0;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar5,&RenderTuning::s_CursorStandard,0,0xffffffff);
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar5,&RenderTuning::s_CursorCurrent,0,0xffffffff);
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    local_708 = 1.0;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar5,&RenderTuning::s_CursorLabels,0,0xffffffff);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])(pIVar4,0xffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])
              ();
    lVar8 = 0;
    do {
      Value = ((float)(int)lVar8 / 100.0) * 3000.0;
      pCVar3 = (this->super_CComponent).m_pClient;
      fVar9 = VelocityRamp(Value,(float)(pCVar3->m_Tuning).m_VelrampStart.m_Value / 100.0,
                           (float)(pCVar3->m_Tuning).m_VelrampRange.m_Value / 100.0,
                           (float)(pCVar3->m_Tuning).m_VelrampCurvature.m_Value / 100.0);
      fVar9 = (fVar9 * Value) / 1000.0;
      local_678[lVar7 * 2] = (float)((int)lVar7 + -2);
      local_678[lVar7 * 2 + 1] = 292.0 - local_708 * 50.0;
      local_678[lVar7 * 2 + 2] = (float)(int)lVar7;
      local_678[lVar7 * 2 + 3] = 292.0 - fVar9 * 50.0;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 2;
      local_708 = fVar9;
    } while (lVar8 != 100);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x16])(pIVar4,local_678,100);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDebugHud::RenderTuning()
{
	// render tuning debugging
	if(!Config()->m_DbgTuning)
		return;

	CTuningParams StandardTuning;

	Graphics()->MapScreen(0, 0, 300*Graphics()->ScreenAspect(), 300);

	static CTextCursor s_CursorStandard(5.0f, 25.0f, 50.0f);
	static CTextCursor s_CursorCurrent(5.0f, 50.0f, 50.0f);
	static CTextCursor s_CursorLabels(5.0f, 55.0f, 50.0f);
	s_CursorStandard.m_MaxLines = -1;
	s_CursorStandard.m_LineSpacing = 1.0f;
	s_CursorStandard.m_Align = TEXTALIGN_TR;
	s_CursorStandard.Reset(0);
	s_CursorCurrent.m_MaxLines = -1;
	s_CursorCurrent.m_LineSpacing = 1.0f;
	s_CursorCurrent.m_Align = TEXTALIGN_TR;
	s_CursorCurrent.Reset();
	s_CursorLabels.m_MaxLines = -1;
	s_CursorLabels.m_LineSpacing = 1.0f;
	s_CursorLabels.Reset(0);

	for(int i = 0; i < m_pClient->m_Tuning.Num(); i++)
	{
		char aBuf[128];
		float Current, Standard;
		m_pClient->m_Tuning.Get(i, &Current);
		StandardTuning.Get(i, &Standard);

		if(Standard == Current)
			TextRender()->TextColor(1,1,1,1.0f);
		else
			TextRender()->TextColor(1,0.25f,0.25f,1.0f);

		str_format(aBuf, sizeof(aBuf), "%.2f", Standard);
		TextRender()->TextDeferred(&s_CursorStandard, aBuf, -1);

		str_format(aBuf, sizeof(aBuf), "%.2f", Current);
		TextRender()->TextDeferred(&s_CursorCurrent, aBuf, -1);

		TextRender()->TextDeferred(&s_CursorLabels, m_pClient->m_Tuning.GetName(i), -1);

		TextRender()->TextNewline(&s_CursorStandard);
		TextRender()->TextNewline(&s_CursorCurrent);
		TextRender()->TextNewline(&s_CursorLabels);
	}

	TextRender()->DrawTextOutlined(&s_CursorStandard);
	TextRender()->DrawTextOutlined(&s_CursorCurrent);
	TextRender()->DrawTextOutlined(&s_CursorLabels);

	float y = 50.0f+m_pClient->m_Tuning.Num()*6;

	Graphics()->TextureClear();
	Graphics()->BlendNormal();
	Graphics()->LinesBegin();
	float Height = 50.0f;
	float pv = 1;
	IGraphics::CLineItem Array[100];
	for(int i = 0; i < 100; i++)
	{
		float Speed = i/100.0f * 3000;
		float Ramp = VelocityRamp(Speed, m_pClient->m_Tuning.m_VelrampStart, m_pClient->m_Tuning.m_VelrampRange, m_pClient->m_Tuning.m_VelrampCurvature);
		float RampedSpeed = (Speed * Ramp)/1000.0f;
		Array[i] = IGraphics::CLineItem((i-1)*2, y+Height-pv*Height, i*2, y+Height-RampedSpeed*Height);
		//Graphics()->LinesDraw((i-1)*2, 200, i*2, 200);
		pv = RampedSpeed;
	}
	Graphics()->LinesDraw(Array, 100);
	Graphics()->LinesEnd();
	TextRender()->TextColor(1,1,1,1);
}